

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_set_absolute_expiry_time
              (PROPERTIES_HANDLE properties,timestamp absolute_expiry_time_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE absolute_expiry_time_amqp_value;
  PROPERTIES_INSTANCE *properties_instance;
  int result;
  timestamp absolute_expiry_time_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x416a;
  }
  else {
    item_value = amqpvalue_create_timestamp(absolute_expiry_time_value);
    if (item_value == (AMQP_VALUE)0x0) {
      properties_instance._4_4_ = 0x4172;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,8,item_value);
      if (iVar1 == 0) {
        properties_instance._4_4_ = 0;
      }
      else {
        properties_instance._4_4_ = 0x4178;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int properties_set_absolute_expiry_time(PROPERTIES_HANDLE properties, timestamp absolute_expiry_time_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE absolute_expiry_time_amqp_value = amqpvalue_create_timestamp(absolute_expiry_time_value);
        if (absolute_expiry_time_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 8, absolute_expiry_time_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(absolute_expiry_time_amqp_value);
        }
    }

    return result;
}